

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

bool __thiscall
trieste::detail::Inside<2UL>::match(Inside<2UL> *this,NodeIt *it,Node *parent,Match *match)

{
  TokenDef *pTVar1;
  TokenDef *pTVar2;
  element_type *peVar3;
  byte bVar4;
  int in_EAX;
  long lVar5;
  
  lVar5 = 0;
  do {
    pTVar1 = (((parent->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             type_).def;
    pTVar2 = *(TokenDef **)((long)&(this->types)._M_elems[0].def + lVar5);
    if (pTVar1 == pTVar2) {
      peVar3 = (this->super_PatternDef).continuation.
               super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 == (element_type *)0x0) {
        in_EAX = 1;
      }
      else {
        in_EAX = (*peVar3->_vptr_PatternDef[4])(peVar3,it,parent,match);
      }
    }
    bVar4 = (byte)in_EAX;
    if (pTVar1 == pTVar2) goto LAB_001ce103;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x10);
  bVar4 = 0;
LAB_001ce103:
  return (bool)(bVar4 & 1);
}

Assistant:

bool match(NodeIt& it, const Node& parent, Match& match) const& override
      {
        for (const auto& type : types)
        {
          if (parent->type() == type)
            return match_continuation(it, parent, match);
        }

        return false;
      }